

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void kj::ArrayDisposer::
     Dispose_<kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry,_false>
     ::destruct(void *ptr)

{
  void *ptr_local;
  
  dtor<kj::HashMap<kj::StringPtr,capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry>
            ((Entry *)ptr);
  return;
}

Assistant:

static void destruct(void* ptr) {
    kj::dtor(*reinterpret_cast<T*>(ptr));
  }